

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_file_exception(sexp ctx,sexp self,char *ms,sexp ir)

{
  sexp psVar1;
  sexp res;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_30;
  local_30 = (sexp)0x43e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_30 = sexp_user_exception(ctx,self,ms,ir);
  psVar1 = sexp_intern(ctx,"file",-1);
  (local_30->value).type.name = psVar1;
  (ctx->value).context.saves = local_28.next;
  return local_30;
}

Assistant:

sexp sexp_file_exception (sexp ctx, sexp self, const char *ms, sexp ir) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_user_exception(ctx, self, ms, ir);
  sexp_exception_kind(res) = sexp_intern(ctx, "file", -1);
  sexp_gc_release1(ctx);
  return res;
}